

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

BasicBlock * __thiscall
spvtools::opt::LoopPeeling::ProtectLoop
          (LoopPeeling *this,Loop *loop,Instruction *condition,BasicBlock *if_merge)

{
  IRContext *pIVar1;
  Analysis preserved_analyses;
  uint32_t cond_id;
  uint32_t true_id;
  uint32_t false_id;
  uint32_t merge_id;
  BasicBlock *parent_block;
  Instruction *inst;
  BasicBlock *this_00;
  undefined1 local_58 [8];
  InstructionBuilder builder;
  BasicBlock *if_block;
  BasicBlock *if_merge_local;
  Instruction *condition_local;
  Loop *loop_local;
  LoopPeeling *this_local;
  
  parent_block = Loop::GetOrCreatePreHeaderBlock(loop);
  Loop::SetPreHeaderBlock(loop,(BasicBlock *)0x0);
  pIVar1 = this->context_;
  BasicBlock::tail((BasicBlock *)&builder.preserved_analyses_);
  inst = utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*
                   ((iterator_template<spvtools::opt::Instruction> *)&builder.preserved_analyses_);
  IRContext::KillInst(pIVar1,inst);
  pIVar1 = this->context_;
  preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)local_58,pIVar1,parent_block,preserved_analyses);
  cond_id = Instruction::result_id(condition);
  this_00 = Loop::GetHeaderBlock(loop);
  true_id = BasicBlock::id(this_00);
  false_id = BasicBlock::id(if_merge);
  merge_id = BasicBlock::id(if_merge);
  InstructionBuilder::AddConditionalBranch
            ((InstructionBuilder *)local_58,cond_id,true_id,false_id,merge_id,0);
  return parent_block;
}

Assistant:

BasicBlock* LoopPeeling::ProtectLoop(Loop* loop, Instruction* condition,
                                     BasicBlock* if_merge) {
  // TODO(1841): Handle failure to create pre-header.
  BasicBlock* if_block = loop->GetOrCreatePreHeaderBlock();
  // Will no longer be a pre-header because of the if.
  loop->SetPreHeaderBlock(nullptr);
  // Kill the branch to the header.
  context_->KillInst(&*if_block->tail());

  InstructionBuilder builder(
      context_, if_block,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  builder.AddConditionalBranch(condition->result_id(),
                               loop->GetHeaderBlock()->id(), if_merge->id(),
                               if_merge->id());

  return if_block;
}